

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setWindowFlags(QWidgetPrivate *this,WindowFlags flags)

{
  bool bVar1;
  Int IVar2;
  QFlagsStorage<Qt::WindowType> QVar3;
  QFlagsStorage<Qt::WindowType> QVar4;
  QWidgetPrivate *this_00;
  Int in_ESI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool windowFlagChanged;
  bool visible;
  QWidget *q;
  QPoint oldPos;
  undefined4 in_stack_00000058;
  QWidget *in_stack_00000060;
  WindowFlags in_stack_000001a0;
  WindowType in_stack_ffffffffffffff9c;
  QFlags<Qt::WindowType> *in_stack_ffffffffffffffa0;
  QFlagsStorage<Qt::WindowType> QVar5;
  QFlagsStorageHelper<Qt::WindowType,_4> local_18;
  Int local_14;
  QFlagsStorageHelper<Qt::WindowType,_4> local_10;
  QFlagsStorage<Qt::WindowType> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = in_ESI;
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  local_10.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       ((*(QWidgetData **)&this_00->field_0x20)->window_flags).
       super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
  local_14 = local_c.i;
  bVar1 = ::operator==((QFlags<Qt::WindowType>)local_10.super_QFlagsStorage<Qt::WindowType>.i,
                       (QFlags<Qt::WindowType>)local_c.i);
  if (!bVar1) {
    QFlags<Qt::WindowType>::operator|
              (in_stack_ffffffffffffffa0,(QFlagsStorageHelper<Qt::WindowType,_4>)SUB84(in_RDI,0));
    local_18.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
    if (IVar2 == 0) {
      ((*(QWidgetData **)&this_00->field_0x20)->window_flags).
      super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i = local_c.i
      ;
    }
    else {
      QWidget::pos((QWidget *)in_RDI);
      bVar1 = QWidget::isVisible((QWidget *)0x37e120);
      QVar5.i = local_c.i;
      QVar3.i = (Int)QFlags<Qt::WindowType>::operator^
                               (in_stack_ffffffffffffffa0,
                                (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84(in_RDI,0));
      QVar4.i = (Int)QFlags<Qt::WindowType>::operator&
                               (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffd4);
      QWidget::parentWidget((QWidget *)0x37e185);
      QWidget::setParent(in_stack_00000060,
                         (QWidget *)
                         CONCAT44(flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                  super_QFlagsStorage<Qt::WindowType>.i,in_stack_00000058),
                         in_stack_000001a0);
      if ((IVar2 == 0) &&
         ((bVar1 || (bVar1 = QWidget::testAttribute
                                       ((QWidget *)in_RDI,(WidgetAttribute)((ulong)this_00 >> 0x20))
                    , bVar1)))) {
        QWidget::move((QWidget *)CONCAT44(QVar4.i,QVar3.i),(QPoint *)CONCAT44(QVar5.i,local_c.i));
      }
      adjustQuitOnCloseAttribute(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setWindowFlags(Qt::WindowFlags flags)
{
    Q_Q(QWidget);
    if (q->data->window_flags == flags)
        return;

    if ((q->data->window_flags | flags) & Qt::Window) {
        // the old type was a window and/or the new type is a window
        QPoint oldPos = q->pos();
        bool visible = q->isVisible();
        const bool windowFlagChanged = (q->data->window_flags ^ flags) & Qt::Window;
        q->setParent(q->parentWidget(), flags);

        // if both types are windows or neither of them are, we restore
        // the old position
        if (!windowFlagChanged && (visible || q->testAttribute(Qt::WA_Moved)))
            q->move(oldPos);
        // for backward-compatibility we change Qt::WA_QuitOnClose attribute value only when the window was recreated.
        adjustQuitOnCloseAttribute();
    } else {
        q->data->window_flags = flags;
    }
}